

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_frostbite(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RCX;
  int in_EDI;
  AFFECT_DATA *paf;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  int in_stack_000024a0;
  int in_stack_000024a4;
  void *in_stack_000024a8;
  void *in_stack_000024b0;
  CHAR_DATA *in_stack_000024b8;
  char *in_stack_000024c0;
  void *in_stack_ffffffffffffff68;
  AFFECT_DATA *pAVar3;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa4);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    iVar2 = number_range(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    if (iVar2 == 0) {
      bVar1 = is_affected(in_RCX,in_EDI);
      if ((bVar1) && (in_RCX->arms < 2)) {
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
            (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
            in_stack_ffffffffffffff68,0);
        act_new(in_stack_000024c0,in_stack_000024b8,in_stack_000024b0,in_stack_000024a8,
                in_stack_000024a4,in_stack_000024a0);
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
            (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
            in_stack_ffffffffffffff68,0);
        for (pAVar3 = in_RCX->affected; pAVar3 != (AFFECT_DATA *)0x0; pAVar3 = pAVar3->next) {
          if ((pAVar3->type == in_EDI) && (pAVar3->location == 1)) {
            affect_remove((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                          ,(AFFECT_DATA *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          }
        }
        init_affect((AFFECT_DATA *)0x6deb5d);
        uVar4 = 3;
        affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       pAVar3);
        bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,uVar4),
                            in_stack_ffffffffffffffa4);
        if (!bVar1) {
          act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pAVar3,0);
          act_new(in_stack_000024c0,in_stack_000024b8,in_stack_000024b0,in_stack_000024a8,
                  in_stack_000024a4,in_stack_000024a0);
          act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pAVar3,0);
          init_affect((AFFECT_DATA *)0x6dec62);
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         pAVar3);
        }
      }
    }
    else {
      bVar1 = is_affected(in_RCX,in_EDI);
      if ((bVar1) && (in_RCX->legs < 2)) {
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
            (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
            in_stack_ffffffffffffff68,0);
        act_new(in_stack_000024c0,in_stack_000024b8,in_stack_000024b0,in_stack_000024a8,
                in_stack_000024a4,in_stack_000024a0);
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
            (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
            in_stack_ffffffffffffff68,0);
        for (pAVar3 = in_RCX->affected; pAVar3 != (AFFECT_DATA *)0x0; pAVar3 = pAVar3->next) {
          if ((pAVar3->type == in_EDI) && (pAVar3->location == 2)) {
            affect_remove((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                          ,(AFFECT_DATA *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          }
        }
        init_affect((AFFECT_DATA *)0x6dedcb);
        uVar4 = 3;
        affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       pAVar3);
        bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,uVar4),
                            in_stack_ffffffffffffffa4);
        if (!bVar1) {
          act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pAVar3,0);
          act_new(in_stack_000024c0,in_stack_000024b8,in_stack_000024b0,in_stack_000024a8,
                  in_stack_000024a4,in_stack_000024a0);
          act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pAVar3,0);
          init_affect((AFFECT_DATA *)0x6deed0);
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         pAVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void spell_frostbite(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af, *paf;

	if (saves_spell(level, victim, DAM_COLD))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (number_range(0, 1) == 0)
	{
		if (is_affected(victim, sn) && victim->arms < 2)
		{
			send_to_char("There is no warmth remaining in their arm to be siphoned away.\n\r", ch);
			return;
		}

		act("$N's arm goes limp as you draw heat from it.", ch, 0, victim, TO_CHAR);
		act_new("Your arm goes limp as $n draws heat from it.", ch, 0, victim, TO_VICT, POS_SLEEPING);
		act("$N's arm goes limp as $n draws heat from it.", ch, 0, victim, TO_NOTVICT);

		for (paf = victim->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->type == sn && paf->location == APPLY_STR)
				affect_remove(victim, paf);
		}

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_STR;
		af.duration = level / 6;
		af.level = level;
		af.modifier = -(level / 5);
		affect_to_char(victim, &af);

		if (!saves_spell(level - 2, victim, DAM_COLD))
		{
			act("$N's screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!", ch, 0, victim, TO_CHAR);
			act_new("Shooting pains run through your arm as $n chills it, and then suddenly, you have no feeling in it at all.", ch, 0, victim, TO_VICT, POS_SLEEPING);
			act("$N's screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!", ch, 0, victim, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.type = sn;
			af.location = APPLY_ARMS;
			af.duration = level / 6;
			af.level = level;
			af.modifier = -1;
			affect_to_char(victim, &af);
		}
	}
	else
	{
		if (is_affected(victim, sn) && victim->legs < 2)
		{
			send_to_char("There is no warmth remaining in their leg to be siphoned away.\n\r", ch);
			return;
		}

		act("$N's leg goes limp as you draw heat from it.", ch, 0, victim, TO_CHAR);
		act_new("Your leg goes limp as $n draws heat from it.", ch, 0, victim, TO_VICT, POS_SLEEPING);
		act("$N's leg goes limp as $n draws heat from it.", ch, 0, victim, TO_NOTVICT);

		for (paf = victim->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->type == sn && paf->location == APPLY_DEX)
				affect_remove(victim, paf);
		}

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_DEX;
		af.duration = level / 6;
		af.level = level;
		af.modifier = -(level / 5);
		affect_to_char(victim, &af);

		if (!saves_spell(level - 2, victim, DAM_COLD))
		{
			act("$N nearly collapses to the ground as $S leg is frozen solid!", ch, 0, victim, TO_CHAR);
			act_new("Shooting pains run through your leg as $n chills it, and then suddenly, you have no feeling in it at all.", ch, 0, victim, TO_VICT, POS_SLEEPING);
			act("$N nearly collapses to the ground as $S leg is frozen solid!", ch, 0, victim, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.type = sn;
			af.location = APPLY_LEGS;
			af.duration = level / 6;
			af.level = level;
			af.modifier = -1;
			affect_to_char(victim, &af);
		}
	}
}